

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *base,
          string *path)

{
  bool bVar1;
  cmStateSnapshot local_68;
  cmStateDirectory local_50;
  string *local_28;
  string *path_local;
  string *base_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_28 = path;
  path_local = base;
  base_local = (string *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  cmLocalGenerator::GetStateSnapshot(&local_68,(cmLocalGenerator *)this);
  cmStateSnapshot::GetDirectory(&local_50,&local_68);
  bVar1 = cmOutputConverter::ContainedInDirectory(base,path,&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    cmOutputConverter::ForceToRelativePath(__return_storage_ptr__,path_local,local_28);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath(
  std::string const& base, std::string const& path)
{
  if (!cmOutputConverter::ContainedInDirectory(
        base, path, this->GetStateSnapshot().GetDirectory())) {
    return path;
  }
  return cmOutputConverter::ForceToRelativePath(base, path);
}